

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::DoSetDead(BackwardPass *this,Opnd *opnd,bool isDead)

{
  bool bVar1;
  bool isDead_local;
  Opnd *opnd_local;
  BackwardPass *this_local;
  
  if (((!isDead) || (this->tag != BackwardPhase)) || (bVar1 = IsPrePass(this), bVar1)) {
    if (this->tag == DeadStorePhase) {
      IR::Opnd::SetIsDead(opnd,isDead);
    }
  }
  else {
    IR::Opnd::SetIsDead(opnd,true);
  }
  return;
}

Assistant:

void
BackwardPass::DoSetDead(IR::Opnd * opnd, bool isDead) const
{
    // Note: Dead bit on the Opnd records flow-based liveness.
    // This is distinct from isLastUse, which records lexical last-ness.
    if (isDead && this->tag == Js::BackwardPhase && !this->IsPrePass())
    {
        opnd->SetIsDead();
    }
    else if (this->tag == Js::DeadStorePhase)
    {
        // Set or reset in DeadStorePhase.
        // CSE could make previous dead operand not the last use, so reset it.
        opnd->SetIsDead(isDead);
    }
}